

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

void amrex::average_node_to_cellcenter
               (MultiFab *cc,int dcomp,MultiFab *nd,int scomp,int ncomp,int ngrow)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  Box bx;
  MFIter mfi;
  long local_1b8;
  long local_1b0;
  Box local_12c;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  MFIter::MFIter(&local_90,(FabArrayBase *)cc,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::growntilebox(&local_12c,&local_90,ngrow);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,&cc->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&nd->super_FabArray<amrex::FArrayBox>,&local_90);
      if (0 < ncomp) {
        lVar4 = (long)local_12c.smallend.vect[0] * 8;
        uVar6 = 0;
        local_1b8 = (long)scomp << 3;
        local_1b0 = (long)dcomp << 3;
        do {
          iVar10 = local_12c.smallend.vect[2];
          if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
            do {
              if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                lVar12 = (long)((iVar10 + 1) - local_110.begin.z) * local_110.kstride * 8 +
                         local_110.nstride * local_1b8 + (long)local_110.begin.x * -8;
                lVar5 = local_110.kstride * 8 * (long)(iVar10 - local_110.begin.z) +
                        local_110.nstride * local_1b8 + (long)local_110.begin.x * -8;
                lVar11 = (long)local_12c.smallend.vect[1];
                do {
                  iVar1 = (int)lVar11;
                  if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                    lVar8 = (lVar11 - local_110.begin.y) * local_110.jstride * 8;
                    lVar2 = lVar8 + lVar12 + lVar4 + 8;
                    lVar8 = lVar8 + lVar5 + lVar4 + 8;
                    lVar7 = (long)((iVar1 + 1) - local_110.begin.y) * local_110.jstride * 8;
                    lVar3 = lVar7 + lVar12 + lVar4;
                    lVar7 = lVar7 + lVar5 + lVar4;
                    lVar9 = 0;
                    do {
                      *(double *)
                       ((long)local_d0.p +
                       lVar9 * 8 +
                       (lVar11 - local_d0.begin.y) * local_d0.jstride * 8 +
                       local_d0.nstride * local_1b0 +
                       (iVar10 - local_d0.begin.z) * local_d0.kstride * 8 +
                       (long)local_d0.begin.x * -8 + lVar4) =
                           (*(double *)((long)local_110.p + lVar9 * 8 + lVar8 + -8) +
                            *(double *)((long)local_110.p + lVar9 * 8 + lVar8) +
                            *(double *)((long)local_110.p + lVar9 * 8 + lVar7) +
                            *(double *)((long)local_110.p + lVar9 * 8 + lVar7 + 8) +
                            *(double *)((long)local_110.p + lVar9 * 8 + lVar2 + -8) +
                            *(double *)((long)local_110.p + lVar9 * 8 + lVar2) +
                            *(double *)((long)local_110.p + lVar9 * 8 + lVar3) +
                           *(double *)((long)local_110.p + lVar9 * 8 + lVar3 + 8)) * 0.125;
                      lVar9 = lVar9 + 1;
                    } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                             (int)lVar9);
                  }
                  lVar11 = lVar11 + 1;
                } while (iVar1 + 1 != local_12c.bigend.vect[1] + 1);
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 != local_12c.bigend.vect[2] + 1);
          }
          uVar6 = uVar6 + 1;
          local_1b8 = local_1b8 + 8;
          local_1b0 = local_1b0 + 8;
        } while (uVar6 != (uint)ncomp);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void average_node_to_cellcenter (MultiFab& cc, int dcomp,
         const MultiFab& nd, int scomp, int ncomp, int ngrow)
    {
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            auto const& ndma = nd.const_arrays();
            ParallelFor(cc, IntVect(ngrow), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                amrex_avg_nd_to_cc(i, j, k, n, ccma[box_no], ndma[box_no], dcomp, scomp);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.growntilebox(ngrow);
                Array4<Real> const& ccarr = cc.array(mfi);
                Array4<Real const> const& ndarr = nd.const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
                {
                    amrex_avg_nd_to_cc(i, j, k, n, ccarr, ndarr, dcomp, scomp);
                });
            }
        }
    }